

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O3

int bcf_update_filter(bcf_hdr_t *hdr,bcf1_t *line,int *flt_ids,int n)

{
  int *piVar1;
  uint uVar2;
  ulong uVar3;
  
  if ((line->unpacked & 2) == 0) {
    bcf_unpack(line,2);
  }
  piVar1 = &(line->d).shared_dirty;
  *(byte *)piVar1 = (byte)*piVar1 | 4;
  (line->d).n_flt = n;
  if (n != 0) {
    if ((line->d).m_flt < n) {
      uVar2 = (int)(n - 1U) >> 1 | n - 1U;
      uVar2 = (int)uVar2 >> 2 | uVar2;
      uVar2 = (int)uVar2 >> 4 | uVar2;
      uVar2 = (int)uVar2 >> 8 | uVar2;
      uVar2 = (int)uVar2 >> 0x10 | uVar2;
      (line->d).m_flt = uVar2 + 1;
      piVar1 = (int *)realloc((line->d).flt,(long)(int)uVar2 * 4 + 4);
      (line->d).flt = piVar1;
    }
    if (0 < n) {
      piVar1 = (line->d).flt;
      uVar3 = 0;
      do {
        piVar1[uVar3] = flt_ids[uVar3];
        uVar3 = uVar3 + 1;
      } while ((uint)n != uVar3);
    }
  }
  return 0;
}

Assistant:

int bcf_update_filter(const bcf_hdr_t *hdr, bcf1_t *line, int *flt_ids, int n)
{
    if ( !(line->unpacked & BCF_UN_FLT) ) bcf_unpack(line, BCF_UN_FLT);
    line->d.shared_dirty |= BCF1_DIRTY_FLT;
    line->d.n_flt = n;
    if ( !n ) return 0;
    hts_expand(int, line->d.n_flt, line->d.m_flt, line->d.flt);
    int i;
    for (i=0; i<n; i++)
        line->d.flt[i] = flt_ids[i];
    return 0;
}